

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  int in_EDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  int i;
  float w_item_last;
  float w_item_one;
  ImGuiStyle *style;
  ImGuiWindow *window;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar6;
  float local_8;
  
  pIVar2 = GetCurrentWindow();
  pIVar1 = GImGui;
  local_8 = in_XMM0_Da;
  if (in_XMM0_Da <= 0.0) {
    local_8 = CalcItemWidth();
  }
  fVar4 = ImMax<float>(1.0,(float)(int)((-(pIVar1->Style).ItemInnerSpacing.x * (float)(in_EDI + -1)
                                        + local_8) / (float)in_EDI));
  fVar5 = ImMax<float>(1.0,(float)(int)(-(fVar4 + (pIVar1->Style).ItemInnerSpacing.x) *
                                        (float)(in_EDI + -1) + local_8));
  ImVector<float>::push_back
            ((ImVector<float> *)CONCAT44(fVar4,fVar5),
             (float *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (iVar6 = 0; iVar6 < in_EDI + -1; iVar6 = iVar6 + 1) {
    ImVector<float>::push_back
              ((ImVector<float> *)CONCAT44(fVar4,fVar5),
               (float *)CONCAT44(iVar6,in_stack_ffffffffffffffd8));
  }
  pfVar3 = ImVector<float>::back(&(pIVar2->DC).ItemWidthStack);
  (pIVar2->DC).ItemWidth = *pfVar3;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}